

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

Value * __thiscall
duckdb::MultiFileColumnMapper::GetConstantValue
          (Value *__return_storage_ptr__,MultiFileColumnMapper *this,idx_t global_index)

{
  size_type __n;
  MultiFileReaderData *pMVar1;
  pointer pcVar2;
  const_reference pvVar3;
  reference this_00;
  pointer pEVar4;
  BoundConstantExpression *pBVar5;
  reference pvVar6;
  const_reference pvVar7;
  InternalException *this_01;
  Value *other;
  size_type __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pvVar3 = vector<duckdb::ColumnIndex,_true>::operator[](this->global_column_ids,global_index);
  __n = pvVar3->index;
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&this->reader_data->expressions,global_index);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((pEVar4->super_BaseExpression).type == VALUE_CONSTANT) {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    pBVar5 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar4->super_BaseExpression);
    other = &pBVar5->value;
LAB_015bb204:
    Value::Value(__return_storage_ptr__,other);
    return __return_storage_ptr__;
  }
  pMVar1 = this->reader_data;
  if ((pMVar1->constant_map).constant_map.
      super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
      super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pMVar1->constant_map).constant_map.
      super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
      super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar6 = vector<duckdb::MultiFileConstantEntry,_true>::operator[]
                         (&(pMVar1->constant_map).constant_map,__n_00);
      if ((pvVar6->column_idx).index == global_index) {
        other = &pvVar6->value;
        goto LAB_015bb204;
      }
      __n_00 = __n_00 + 1;
      pMVar1 = this->reader_data;
    } while (__n_00 < (ulong)(((long)(pMVar1->constant_map).constant_map.
                                     super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                                     .
                                     super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pMVar1->constant_map).constant_map.
                                     super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                                     .
                                     super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  pvVar7 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[](this->global_columns,__n);
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Column \'%s\' is not present in the file, but no constant_map entry exists for it!",""
            );
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (pvVar7->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (pvVar7->name)._M_string_length);
  InternalException::InternalException<std::__cxx11::string>(this_01,&local_50,&local_70);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Value MultiFileColumnMapper::GetConstantValue(idx_t global_index) {
	auto global_column_id = global_column_ids[global_index].GetPrimaryIndex();
	auto &expr = reader_data.expressions[global_index];
	if (expr->type == ExpressionType::VALUE_CONSTANT) {
		return expr->Cast<BoundConstantExpression>().value;
	}
	for (idx_t i = 0; i < reader_data.constant_map.size(); i++) {
		auto &constant_map_entry = reader_data.constant_map[MultiFileConstantMapIndex(i)];
		if (constant_map_entry.column_idx.GetIndex() == global_index) {
			return constant_map_entry.value;
		}
	}
	auto &global_column = global_columns[global_column_id];
	throw InternalException("Column '%s' is not present in the file, but no constant_map entry exists for it!",
	                        global_column.name);
}